

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.hpp
# Opt level: O2

error_code __thiscall
asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&>::
set_verify_callback<std::_Bind<bool(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client*,std::_Placeholder<1>,std::_Placeholder<2>))(bool,asio::ssl::verify_context&)>>
          (stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&> *this,
          _Bind<bool_(nuraft::asio_rpc_client::*(nuraft::asio_rpc_client_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(bool,_asio::ssl::verify_context_&)>
          *callback,error_code *ec)

{
  _func_int **pp_Var1;
  verify_callback_base *callback_00;
  error_code eVar2;
  
  callback_00 = (verify_callback_base *)operator_new(0x20);
  pp_Var1 = *(_func_int ***)&callback->field_0x8;
  callback_00[1]._vptr_verify_callback_base = (_func_int **)callback->_M_f;
  callback_00[2]._vptr_verify_callback_base = pp_Var1;
  callback_00[3]._vptr_verify_callback_base =
       (_func_int **)
       (callback->_M_bound_args).
       super__Tuple_impl<0UL,_nuraft::asio_rpc_client_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>
       .super__Head_base<0UL,_nuraft::asio_rpc_client_*,_false>._M_head_impl;
  callback_00->_vptr_verify_callback_base = (_func_int **)&PTR__verify_callback_base_006080f8;
  detail::engine::set_verify_callback((engine *)(this + 8),callback_00,ec);
  eVar2._4_4_ = 0;
  eVar2._M_value = ec->_M_value;
  eVar2._M_cat = ec->_M_cat;
  return eVar2;
}

Assistant:

ASIO_SYNC_OP_VOID set_verify_callback(VerifyCallback callback,
      asio::error_code& ec)
  {
    core_.engine_.set_verify_callback(
        new detail::verify_callback<VerifyCallback>(callback), ec);
    ASIO_SYNC_OP_VOID_RETURN(ec);
  }